

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ApiExit(sqlite3 *db,int rc)

{
  uint local_1c;
  uint local_14;
  int rc_local;
  sqlite3 *db_local;
  
  local_14 = rc;
  if ((db != (sqlite3 *)0x0) && ((db->mallocFailed != '\0' || (rc == 0xc0a)))) {
    sqlite3Error(db,7,(char *)0x0);
    db->mallocFailed = '\0';
    local_14 = 7;
  }
  if (db == (sqlite3 *)0x0) {
    local_1c = 0xff;
  }
  else {
    local_1c = db->errMask;
  }
  return local_14 & local_1c;
}

Assistant:

SQLITE_PRIVATE int sqlite3ApiExit(sqlite3* db, int rc){
  /* If the db handle is not NULL, then we must hold the connection handle
  ** mutex here. Otherwise the read (and possible write) of db->mallocFailed 
  ** is unsafe, as is the call to sqlite3Error().
  */
  assert( !db || sqlite3_mutex_held(db->mutex) );
  if( db && (db->mallocFailed || rc==SQLITE_IOERR_NOMEM) ){
    sqlite3Error(db, SQLITE_NOMEM, 0);
    db->mallocFailed = 0;
    rc = SQLITE_NOMEM;
  }
  return rc & (db ? db->errMask : 0xff);
}